

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l1_norm(default_cost_type<float> *this,int n)

{
  bool bVar1;
  type pfVar2;
  unique_ptr<float[],_std::default_delete<float[]>_> *this_00;
  float fVar3;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  float div;
  int n_local;
  default_cost_type<float> *this_local;
  
  i_1 = 0;
  for (local_1c = 0; local_1c != n; local_1c = local_1c + 1) {
    this_00 = &this->linear_elements;
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (this_00,(long)local_1c);
    fVar3 = *pfVar2;
    std::abs((int)this_00);
    i_1 = (int)(fVar3 + (float)i_1);
  }
  bVar1 = std::isnormal((float)i_1);
  if (bVar1) {
    for (local_20 = 0; local_20 != n; local_20 = local_20 + 1) {
      pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->linear_elements,(long)local_20);
      *pfVar2 = *pfVar2 / (float)i_1;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }